

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

void canvas_path(_glist *x,_canvasenvironment *e,char *path)

{
  int iVar1;
  t_namelist *ptVar2;
  char local_418 [8];
  char strbuf [1000];
  t_namelist *local_28;
  t_namelist *nl;
  char *path_local;
  _canvasenvironment *e_local;
  _glist *x_local;
  
  iVar1 = sys_isabsolutepath(path);
  if (iVar1 == 0) {
    iVar1 = strncmp("./",path,2);
    if ((iVar1 != 0) && (iVar1 = strncmp("../",path,3), iVar1 != 0)) {
      canvas_completepath(path,local_418,1000,x);
      iVar1 = check_exists(local_418);
      if (iVar1 != 0) {
        ptVar2 = namelist_append(e->ce_path,path,0);
        e->ce_path = ptVar2;
        return;
      }
      for (local_28 = (pd_maininstance.pd_stuff)->st_searchpath; local_28 != (t_namelist *)0x0;
          local_28 = local_28->nl_next) {
        snprintf(local_418,999,"%s/%s/",local_28->nl_string,path);
        strbuf[0x3df] = '\0';
        iVar1 = check_exists(local_418);
        if (iVar1 != 0) {
          ptVar2 = namelist_append(e->ce_path,local_418,0);
          e->ce_path = ptVar2;
          return;
        }
      }
      local_28 = (pd_maininstance.pd_stuff)->st_staticpath;
      while( true ) {
        if (local_28 == (t_namelist *)0x0) {
          return;
        }
        snprintf(local_418,999,"%s/%s/",local_28->nl_string,path);
        strbuf[0x3df] = '\0';
        iVar1 = check_exists(local_418);
        if (iVar1 != 0) break;
        local_28 = local_28->nl_next;
      }
      ptVar2 = namelist_append(e->ce_path,local_418,0);
      e->ce_path = ptVar2;
      return;
    }
    ptVar2 = namelist_append(e->ce_path,path,0);
    e->ce_path = ptVar2;
  }
  else {
    ptVar2 = namelist_append(e->ce_path,path,0);
    e->ce_path = ptVar2;
  }
  return;
}

Assistant:

static void canvas_path(t_canvas *x, t_canvasenvironment *e, const char *path)
{
    t_namelist *nl;
    char strbuf[MAXPDSTRING];
    if (sys_isabsolutepath(path))
    {
        e->ce_path = namelist_append(e->ce_path, path, 0);
        return;
    }

        /* explicit relative path, starts with ./ or ../ */
    if ((strncmp("./", path, 2) == 0) || (strncmp("../", path, 3) == 0))
    {
        e->ce_path = namelist_append(e->ce_path, path, 0);
        return;
    }

        /* check if path is a subdir of the canvas-path */
    canvas_completepath(path, strbuf, MAXPDSTRING, x);
    if (check_exists(strbuf))
    {
        e->ce_path = namelist_append(e->ce_path, path, 0);
        return;
    }

        /* check whether the given subdir is in one of the user search-paths */
    for (nl=STUFF->st_searchpath; nl; nl=nl->nl_next)
    {
        snprintf(strbuf, MAXPDSTRING-1, "%s/%s/", nl->nl_string, path);
        strbuf[MAXPDSTRING-1]=0;
        if (check_exists(strbuf))
        {
            e->ce_path = namelist_append(e->ce_path, strbuf, 0);
            return;
        }
    }

        /* check whether the given subdir is in one of the standard-paths */
    for (nl=STUFF->st_staticpath; nl; nl=nl->nl_next)
    {
        snprintf(strbuf, MAXPDSTRING-1, "%s/%s/", nl->nl_string, path);
        strbuf[MAXPDSTRING-1]=0;
        if (check_exists(strbuf))
        {
            e->ce_path = namelist_append(e->ce_path, strbuf, 0);
            return;
        }
    }
}